

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::vector<crnlib::dynamic_string>::erase
          (vector<crnlib::dynamic_string> *this,uint start,uint n)

{
  uint uVar1;
  dynamic_string *p;
  
  uVar1 = this->m_size;
  if (n != 0 && n + start <= uVar1) {
    p = this->m_p + start;
    helpers::destruct_array<crnlib::dynamic_string>(p,n);
    memmove(p,p + n,(ulong)(uVar1 - (n + start)) << 4);
    this->m_size = this->m_size - n;
  }
  return;
}

Assistant:

inline void erase(uint start, uint n) {
    CRNLIB_ASSERT((start + n) <= m_size);
    if ((start + n) > m_size)
      return;

    if (!n)
      return;

    const uint num_to_move = m_size - (start + n);

    T* pDst = m_p + start;

    const T* pSrc = m_p + start + n;

    if (CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(T)) {
      // This test is overly cautious.
      if ((!CRNLIB_IS_BITWISE_COPYABLE(T)) || (CRNLIB_HAS_DESTRUCTOR(T))) {
        // Type has been marked explictly as bitwise movable, which means we can move them around but they may need to be destructed.
        // First destroy the erased objects.
        scalar_type<T>::destruct_array(pDst, n);
      }

      // Copy "down" the objects to preserve, filling in the empty slots.
      memmove(pDst, pSrc, num_to_move * sizeof(T));
    } else {
      // Type is not bitwise copyable or movable.
      // Move them down one at a time by using the equals operator, and destroying anything that's left over at the end.
      T* pDst_end = pDst + num_to_move;
      while (pDst != pDst_end)
        *pDst++ = *pSrc++;

      scalar_type<T>::destruct_array(pDst_end, n);
    }

    m_size -= n;
  }